

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand.cpp
# Opt level: O0

void __thiscall Printer::Printer(Printer *this,io_context *io_context)

{
  io_context *piVar1;
  type *in_R8;
  Printer *local_108;
  code *local_100;
  undefined8 local_f8;
  type local_f0;
  executor_binder<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand>
  local_d8;
  Printer *local_b0;
  code *local_a8;
  undefined8 local_a0;
  type local_98;
  executor_binder<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand>
  local_80;
  int local_54;
  duration<long,_std::ratio<1L,_1L>_> local_50;
  duration local_48 [3];
  int local_2c;
  duration<long,_std::ratio<1L,_1L>_> local_28;
  duration local_20;
  io_context *local_18;
  io_context *io_context_local;
  Printer *this_local;
  
  local_18 = io_context;
  io_context_local = (io_context *)this;
  boost::asio::io_context::strand::strand(&this->strand_,io_context);
  piVar1 = local_18;
  local_2c = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_28,&local_2c);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_20,&local_28);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>(&this->timer1_,piVar1,&local_20,(type *)0x0);
  piVar1 = local_18;
  local_54 = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_50,&local_54);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)local_48,&local_50);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>(&this->timer2_,piVar1,local_48,(type *)0x0);
  this->count_ = 0;
  local_a8 = Print1;
  local_a0 = 0;
  local_b0 = this;
  std::bind<void(Printer::*)(),Printer*>(&local_98,(offset_in_Printer_to_subr *)&local_a8,&local_b0)
  ;
  boost::asio::
  bind_executor<boost::asio::io_context::strand,std::_Bind<void(Printer::*(Printer*))()>>
            (&local_80,(asio *)this,(strand *)&local_98,(_Bind<void_(Printer::*(Printer_*))()> *)0x0
             ,in_R8);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_wait<boost::asio::executor_binder<std::_Bind<void(Printer::*(Printer*))()>,boost::asio::io_context::strand>>
            ((basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->timer1_,&local_80);
  boost::asio::
  executor_binder<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand>::
  ~executor_binder(&local_80);
  local_100 = Print2;
  local_f8 = 0;
  local_108 = this;
  std::bind<void(Printer::*)(),Printer*>
            (&local_f0,(offset_in_Printer_to_subr *)&local_100,&local_108);
  boost::asio::
  bind_executor<boost::asio::io_context::strand,std::_Bind<void(Printer::*(Printer*))()>>
            (&local_d8,(asio *)this,(strand *)&local_f0,(_Bind<void_(Printer::*(Printer_*))()> *)0x0
             ,in_R8);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_wait<boost::asio::executor_binder<std::_Bind<void(Printer::*(Printer*))()>,boost::asio::io_context::strand>>
            ((basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->timer2_,&local_d8);
  boost::asio::
  executor_binder<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand>::
  ~executor_binder(&local_d8);
  return;
}

Assistant:

explicit Printer(boost::asio::io_context& io_context)
      : strand_(io_context),
        timer1_(io_context, std::chrono::seconds(1)),
        timer2_(io_context, std::chrono::seconds(1)) {
    timer1_.async_wait(
        boost::asio::bind_executor(strand_, std::bind(&Printer::Print1, this)));
    timer2_.async_wait(
        boost::asio::bind_executor(strand_, std::bind(&Printer::Print2, this)));
  }